

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O1

char ** __thiscall NaParams::FetchParam(NaParams *this,char *szParamName)

{
  void *pvVar1;
  undefined4 *puVar2;
  item_t it;
  char *local_10;
  undefined8 local_8;
  
  local_8 = 0;
  local_10 = szParamName;
  pvVar1 = bsearch(&local_10,this->storage,(long)this->stored_n,0x10,stored_cmp);
  if (pvVar1 != (void *)0x0) {
    return (char **)((long)pvVar1 + 8);
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xd;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

char*&
NaParams::FetchParam (const char* szParamName)
{
  item_t	it, *pit;
  it.name = (char*)szParamName;
  it.value = NULL;

  const char	*szParamValue = "?not found";

  pit = (item_t*)bsearch(&it, storage, stored_n, sizeof(item_t), stored_cmp);
  if(NULL != pit)
    return pit->value;

  throw(na_not_found);
}